

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

QSizeF viewItemTextLayout(QTextLayout *textLayout,int lineWidth,int maxHeight,int *lastVisibleLine)

{
  QSizeF QVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int *in_RCX;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_ESI;
  long in_FS_OFFSET;
  double dVar5;
  int i;
  qreal height;
  QTextLine nextLine;
  QTextLine line;
  qreal widthUsed;
  int local_8c;
  int local_7c;
  qreal local_78;
  undefined1 *local_58;
  QTextEngine *local_50;
  double local_48;
  QPointF local_40;
  QTextLine local_30;
  double local_20;
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX != (int *)0x0) {
    *in_RCX = -1;
  }
  local_78 = 0.0;
  local_20 = 0.0;
  QTextLayout::beginLayout();
  local_7c = 0;
  do {
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30.eng = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QTextLayout::createLine();
    local_30.index = iVar3;
    local_30.eng = (QTextEngine *)CONCAT44(extraout_var,extraout_EDX);
    bVar2 = QTextLine::isValid(&local_30);
    if (!bVar2) {
LAB_003c3062:
      QTextLayout::endLayout();
      QSizeF::QSizeF(&local_18,local_20,local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      QVar1.ht = local_18.ht;
      QVar1.wd = local_18.wd;
      return QVar1;
    }
    QTextLine::setLineWidth((double)in_ESI);
    QPointF::QPointF(&local_40,0.0,local_78);
    QTextLine::setPosition((QPointF *)&local_30);
    dVar5 = (double)QTextLine::height();
    local_78 = dVar5 + local_78;
    local_48 = (double)QTextLine::naturalTextWidth();
    pdVar4 = qMax<double>(&local_20,&local_48);
    local_20 = *pdVar4;
    if (((0 < in_EDX) && (in_RCX != (int *)0x0)) &&
       (dVar5 = (double)QTextLine::height(), (double)in_EDX < local_78 + dVar5)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QTextLayout::createLine();
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,iVar3);
      local_50 = (QTextEngine *)CONCAT44(extraout_var_00,extraout_EDX_00);
      bVar2 = QTextLine::isValid((QTextLine *)&local_58);
      if (bVar2) {
        local_8c = local_7c;
      }
      else {
        local_8c = -1;
      }
      *in_RCX = local_8c;
      goto LAB_003c3062;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

static QSizeF viewItemTextLayout(QTextLayout &textLayout, int lineWidth, int maxHeight = -1, int *lastVisibleLine = nullptr)
{
    if (lastVisibleLine)
        *lastVisibleLine = -1;
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    int i = 0;
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
        // we assume that the height of the next line is the same as the current one
        if (maxHeight > 0 && lastVisibleLine && height + line.height() > maxHeight) {
            const QTextLine nextLine = textLayout.createLine();
            *lastVisibleLine = nextLine.isValid() ? i : -1;
            break;
        }
        ++i;
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}